

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

uint64_t Imf_3_4::anon_unknown_2::readVariableLengthInteger(char **readPtr,char *endPtr)

{
  byte bVar1;
  ulong uVar2;
  InputExc *this;
  byte bVar3;
  byte *pbVar4;
  
  bVar3 = 0;
  uVar2 = 0;
  pbVar4 = (byte *)*readPtr;
  do {
    if (endPtr <= pbVar4) {
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(this,"IDManifest too small for variable length integer");
      __cxa_throw(this,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
    *readPtr = (char *)(pbVar4 + 1);
    bVar1 = *pbVar4;
    uVar2 = uVar2 | (ulong)(bVar1 & 0x7f) << (bVar3 & 0x3f);
    bVar3 = bVar3 + 7;
    pbVar4 = pbVar4 + 1;
  } while ((char)bVar1 < '\0');
  return uVar2;
}

Assistant:

uint64_t
readVariableLengthInteger (const char*& readPtr, const char* endPtr)
{
    // bytes are stored LSB first, so each byte that is read from the stream must be
    // shifted before mixing into the existing length
    int           shift = 0;
    unsigned char byte  = 0;
    uint64_t      value = 0;
    do
    {
        if (readPtr >= endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for variable length integer");
        }
        byte = *(unsigned char*) readPtr++;
        // top bit of byte isn't part of actual number, it just indicates there's more info to come
        // so take bottom 7 bits, shift them to the right place, and insert them
        //
        value |= (uint64_t (byte & 127)) << shift;
        shift += 7;
    } while (byte &
             128); //while top bit set on previous byte, there is more to come
    return value;
}